

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall sentencepiece::ModelProto::MergeFrom(ModelProto *this,ModelProto *from)

{
  InternalMetadata *this_00;
  uint uVar1;
  void *pvVar2;
  Rep *pRVar3;
  void **our_elems;
  TrainerSpec *this_01;
  NormalizerSpec *pNVar4;
  SelfTestData *this_02;
  int iVar5;
  undefined1 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Arena *pAVar8;
  
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar2 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      pbVar7 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::_M_append
              ((char *)pbVar7,*(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  iVar5 = (from->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar3 = (from->pieces_).super_RepeatedPtrFieldBase.rep_;
    our_elems = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->pieces_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
              (&(this->pieces_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,iVar5,
               ((this->pieces_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->pieces_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
    (this->pieces_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar3 = (this->pieces_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar5) {
      pRVar3->allocated_size = iVar5;
    }
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      this_01 = this->trainer_spec_;
      if (this_01 == (TrainerSpec *)0x0) {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        this_01 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::TrainerSpec>(pAVar8);
        this->trainer_spec_ = this_01;
      }
      puVar6 = (undefined1 *)from->trainer_spec_;
      if ((TrainerSpec *)puVar6 == (TrainerSpec *)0x0) {
        puVar6 = _TrainerSpec_default_instance_;
      }
      TrainerSpec::MergeFrom(this_01,(TrainerSpec *)puVar6);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pNVar4 = this->normalizer_spec_;
      if (pNVar4 == (NormalizerSpec *)0x0) {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        pNVar4 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>(pAVar8);
        this->normalizer_spec_ = pNVar4;
      }
      puVar6 = (undefined1 *)from->normalizer_spec_;
      if ((NormalizerSpec *)puVar6 == (NormalizerSpec *)0x0) {
        puVar6 = _NormalizerSpec_default_instance_;
      }
      NormalizerSpec::MergeFrom(pNVar4,(NormalizerSpec *)puVar6);
    }
    if ((uVar1 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      this_02 = this->self_test_data_;
      if (this_02 == (SelfTestData *)0x0) {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        this_02 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::SelfTestData>(pAVar8);
        this->self_test_data_ = this_02;
      }
      puVar6 = (undefined1 *)from->self_test_data_;
      if ((SelfTestData *)puVar6 == (SelfTestData *)0x0) {
        puVar6 = _SelfTestData_default_instance_;
      }
      SelfTestData::MergeFrom(this_02,(SelfTestData *)puVar6);
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pNVar4 = this->denormalizer_spec_;
      if (pNVar4 == (NormalizerSpec *)0x0) {
        pAVar8 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar8 & 1) != 0) {
          pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
        }
        pNVar4 = google::protobuf::Arena::CreateMaybeMessage<sentencepiece::NormalizerSpec>(pAVar8);
        this->denormalizer_spec_ = pNVar4;
      }
      puVar6 = (undefined1 *)from->denormalizer_spec_;
      if ((NormalizerSpec *)puVar6 == (NormalizerSpec *)0x0) {
        puVar6 = _NormalizerSpec_default_instance_;
      }
      NormalizerSpec::MergeFrom(pNVar4,(NormalizerSpec *)puVar6);
      return;
    }
  }
  return;
}

Assistant:

void ModelProto::MergeFrom(const ModelProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:sentencepiece.ModelProto)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pieces_.MergeFrom(from.pieces_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_mutable_trainer_spec()->::sentencepiece::TrainerSpec::MergeFrom(from._internal_trainer_spec());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_normalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_normalizer_spec());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_mutable_self_test_data()->::sentencepiece::SelfTestData::MergeFrom(from._internal_self_test_data());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_denormalizer_spec()->::sentencepiece::NormalizerSpec::MergeFrom(from._internal_denormalizer_spec());
    }
  }
}